

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::Clipper::CheckHoleLinkages1(Clipper *this,OutRec *outRec1,OutRec *outRec2)

{
  value_type pOVar1;
  bool bVar2;
  OutRec *pOVar3;
  reference ppOVar4;
  OutRec *orec;
  size_type i;
  OutRec *outRec2_local;
  OutRec *outRec1_local;
  Clipper *this_local;
  
  orec = (OutRec *)0x0;
  while( true ) {
    pOVar3 = (OutRec *)
             std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::size
                       (&this->m_PolyOuts);
    if (pOVar3 <= orec) break;
    ppOVar4 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,(size_type)orec);
    pOVar1 = *ppOVar4;
    if ((((pOVar1->isHole & 1U) != 0) && (pOVar1->bottomPt != (OutPt *)0x0)) &&
       (pOVar1->FirstLeft == outRec1)) {
      bVar2 = PointInPolygon(&pOVar1->bottomPt->pt,outRec1->pts,
                             (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                          [(long)&(this->m_PolyOuts).
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                          ] & 1));
      if (!bVar2) {
        pOVar1->FirstLeft = outRec2;
      }
    }
    orec = (OutRec *)((long)&orec->idx + 1);
  }
  return;
}

Assistant:

void Clipper::CheckHoleLinkages1(OutRec *outRec1, OutRec *outRec2)
{
  //when a polygon is split into 2 polygons, make sure any holes the original
  //polygon contained link to the correct polygon ...
  for (PolyOutList::size_type i = 0; i < m_PolyOuts.size(); ++i)
  {
    OutRec *orec = m_PolyOuts[i];
    if (orec->isHole && orec->bottomPt && orec->FirstLeft == outRec1 &&
      !PointInPolygon(orec->bottomPt->pt, outRec1->pts, m_UseFullRange))
        orec->FirstLeft = outRec2;
  }
}